

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int llhttp_should_keep_alive(llhttp_t *parser)

{
  uint uVar1;
  
  if ((parser->http_major == '\0') || (parser->http_minor == '\0')) {
    if ((parser->flags & 1) != 0) goto LAB_00103982;
  }
  else if ((parser->flags & 2) == 0) {
LAB_00103982:
    uVar1 = llhttp_message_needs_eof(parser);
    return uVar1 ^ 1;
  }
  return 0;
}

Assistant:

int llhttp_should_keep_alive(const llhttp_t* parser) {
  if (parser->http_major > 0 && parser->http_minor > 0) {
    /* HTTP/1.1 */
    if (parser->flags & F_CONNECTION_CLOSE) {
      return 0;
    }
  } else {
    /* HTTP/1.0 or earlier */
    if (!(parser->flags & F_CONNECTION_KEEP_ALIVE)) {
      return 0;
    }
  }

  return !llhttp_message_needs_eof(parser);
}